

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

bool GlobOpt::NeedsTypeCheckBailOut
               (Instr *instr,PropertySymOpnd *propertySymOpnd,bool isStore,
               bool *pIsTypeCheckProtected,BailOutKind *pBailOutKind)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  BailOutKind BVar11;
  nullptr_t local_50;
  bool *local_48;
  BailOutKind *local_40;
  uint local_34;
  
  OVar1 = instr->m_opcode;
  if (OVar1 == LdMethodFldPolyInlineMiss) {
    return false;
  }
  if (OVar1 == CheckPropertyGuardAndLoadType) {
    return false;
  }
  local_48 = pIsTypeCheckProtected;
  if ((OVar1 == CheckFixedFld) &&
     (((((ushort)propertySymOpnd->field_12 & 2) == 0 ||
       (propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0)) ||
      ((bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(propertySymOpnd), !bVar3 &&
       (((ushort)propertySymOpnd->field_12 & 2) == 0)))))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x5a4,
                       "(instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection()))"
                       ,
                       "instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection())"
                      );
    if (!bVar3) goto LAB_0048e71b;
    *puVar8 = 0;
  }
  if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     ((bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(propertySymOpnd), !bVar3 &&
      (((ushort)propertySymOpnd->field_12 & 2) == 0)))) {
    bVar3 = false;
    BVar7 = BailOutInvalid;
    if (instr->m_opcode == CheckFixedFld) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x5bf,"(instr->m_opcode != Js::OpCode::CheckFixedFld)",
                         "instr->m_opcode != Js::OpCode::CheckFixedFld");
      if (bVar3) {
        *puVar8 = 0;
        bVar3 = false;
        BVar7 = BailOutInvalid;
        goto LAB_0048e6f2;
      }
      goto LAB_0048e71b;
    }
    goto LAB_0048e6f2;
  }
  local_34 = (uint)instr->m_opcode;
  if (local_34 == 0x270) {
    local_40 = pBailOutKind;
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(instr->m_func->m_workItem);
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FixedMethodsPhase,uVar5,uVar6);
    if (bVar3) {
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo(instr->m_func->m_workItem);
      uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,UseFixedDataPropsPhase,uVar5,uVar6);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5aa,
                           "(!isCheckFixedFld || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                           ,"CheckFixedFld with fixed method/data phase disabled?");
        if (!bVar3) goto LAB_0048e71b;
        *puVar8 = 0;
      }
    }
    pBailOutKind = local_40;
    if (isStore) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x5ab,"(!isStore || !isCheckFixedFld)","!isStore || !isCheckFixedFld");
      if (!bVar3) goto LAB_0048e71b;
      *puVar8 = 0;
LAB_0048e61b:
      if ((propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
         (bVar3 = ObjTypeSpecFldInfo::IsLoadedFromProto(propertySymOpnd->objTypeSpecFldInfo), bVar3)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5ad,"(!isStore || !propertySymOpnd->IsLoadedFromProto())",
                           "!isStore || !propertySymOpnd->IsLoadedFromProto()");
        if (!bVar3) {
LAB_0048e71b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
  }
  else if (isStore) goto LAB_0048e61b;
  bVar3 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(propertySymOpnd);
  if (!bVar3) {
    bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(propertySymOpnd);
    *local_48 = (bool)(((propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags & 8) >> 3 &
                      bVar4);
    BVar7 = BailOutInvalid;
    goto LAB_0048e6f2;
  }
  if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     (bVar4 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(propertySymOpnd->objTypeSpecFldInfo), !bVar4)
     ) {
LAB_0048e6be:
    BVar11 = BailOutFailedFixedFieldTypeCheck;
    BVar7 = BailOutFailedTypeCheck;
  }
  else {
    local_50 = (nullptr_t)0x0;
    bVar4 = JITTypeHolderBase<void>::operator!=(&propertySymOpnd->monoGuardType,&local_50);
    if (bVar4) goto LAB_0048e6be;
    BVar11 = BailOutFailedEquivalentFixedFieldTypeCheck;
    BVar7 = BailOutFailedEquivalentTypeCheck;
  }
  if ((short)local_34 == 0x270) {
    BVar7 = BVar11;
  }
LAB_0048e6f2:
  *pBailOutKind = BVar7;
  return bVar3;
}

Assistant:

bool
GlobOpt::NeedsTypeCheckBailOut(const IR::Instr *instr, IR::PropertySymOpnd *propertySymOpnd, bool isStore, bool* pIsTypeCheckProtected, IR::BailOutKind *pBailOutKind)
{
    if (instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss)
    {
        return false;
    }
    // CheckFixedFld always requires a type check and bailout either at the instruction or upstream.
    Assert(instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection()));

    if (propertySymOpnd->MayNeedTypeCheckProtection())
    {
        bool isCheckFixedFld = instr->m_opcode == Js::OpCode::CheckFixedFld;
        AssertMsg(!isCheckFixedFld || !PHASE_OFF(Js::FixedMethodsPhase, instr->m_func) ||
            !PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func), "CheckFixedFld with fixed method/data phase disabled?");
        Assert(!isStore || !isCheckFixedFld);
        // We don't share caches between field loads and stores.  We should never have a field store involving a proto cache.
        Assert(!isStore || !propertySymOpnd->IsLoadedFromProto());

        if (propertySymOpnd->NeedsTypeCheckAndBailOut())
        {
            *pBailOutKind = propertySymOpnd->HasEquivalentTypeSet() && !propertySymOpnd->MustDoMonoCheck() ?
                (isCheckFixedFld ? IR::BailOutFailedEquivalentFixedFieldTypeCheck : IR::BailOutFailedEquivalentTypeCheck) :
                (isCheckFixedFld ? IR::BailOutFailedFixedFieldTypeCheck : IR::BailOutFailedTypeCheck);
            return true;
        }
        else
        {
            *pIsTypeCheckProtected = propertySymOpnd->IsTypeCheckProtected();
            *pBailOutKind = IR::BailOutInvalid;
            return false;
        }
    }
    else
    {
        Assert(instr->m_opcode != Js::OpCode::CheckFixedFld);
        *pBailOutKind = IR::BailOutInvalid;
        return false;
    }
}